

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::InvalidVSInputsTest::getIterationName_abi_cxx11_
          (string *__return_storage_ptr__,InvalidVSInputsTest *this,_test_iteration iteration)

{
  TestError *this_00;
  _test_iteration iteration_local;
  InvalidVSInputsTest *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(iteration) {
  case TEST_ITERATION_FIRST:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Invalid bool input");
    break;
  case TEST_ITERATION_INVALID_BVEC2_INPUT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Invalid bvec2 input");
    break;
  case TEST_ITERATION_INVALID_BVEC3_INPUT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Invalid bvec3 input");
    break;
  case TEST_ITERATION_INVALID_BVEC4_INPUT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Invalid bvec4 input");
    break;
  case TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Invalid centroid-qualified input");
    break;
  case TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Invalid patch-qualified input");
    break;
  case TEST_ITERATION_INVALID_OPAQUE_TYPE_INPUT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Invalid opaque type input");
    break;
  case TEST_ITERATION_INVALID_STRUCTURE_INPUT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Invalid structure input");
    break;
  case TEST_ITERATION_INVALID_SAMPLE_QUALIFIED_INPUT:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Invalid sample-qualified input");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized test iteration type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
               ,0x50d);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InvalidVSInputsTest::getIterationName(_test_iteration iteration) const
{
	std::string result;

	switch (iteration)
	{
	case TEST_ITERATION_INVALID_BOOL_INPUT:
		result = "Invalid bool input";
		break;
	case TEST_ITERATION_INVALID_BVEC2_INPUT:
		result = "Invalid bvec2 input";
		break;
	case TEST_ITERATION_INVALID_BVEC3_INPUT:
		result = "Invalid bvec3 input";
		break;
	case TEST_ITERATION_INVALID_BVEC4_INPUT:
		result = "Invalid bvec4 input";
		break;
	case TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT:
		result = "Invalid centroid-qualified input";
		break;
	case TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT:
		result = "Invalid patch-qualified input";
		break;
	case TEST_ITERATION_INVALID_OPAQUE_TYPE_INPUT:
		result = "Invalid opaque type input";
		break;
	case TEST_ITERATION_INVALID_STRUCTURE_INPUT:
		result = "Invalid structure input";
		break;
	case TEST_ITERATION_INVALID_SAMPLE_QUALIFIED_INPUT:
		result = "Invalid sample-qualified input";
		break;

	default:
		TCU_FAIL("Unrecognized test iteration type.");
	} /* switch (iteration) */

	return result;
}